

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall TLaplaceExample1::TLaplaceExample1(TLaplaceExample1 *this,TLaplaceExample1 *cp)

{
  long in_RSI;
  TPZFNMatrix<9,_double> *in_RDI;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  TPZAnalyticSolution *in_stack_ffffffffffffffb8;
  TPZAnalyticSolution *in_stack_ffffffffffffffc0;
  TPZManVector<double,_3> *in_stack_ffffffffffffffe0;
  
  TPZAnalyticSolution::TPZAnalyticSolution(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (in_RDI->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TLaplaceExample1_025a32a8;
  *(undefined4 *)
   ((long)&(in_RDI->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 4)
       = 2;
  *(undefined4 *)
   &(in_RDI->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
       *(undefined4 *)(in_RSI + 0x10);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffffe0,
             (int64_t)&(in_RDI->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fDecomposed);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_RDI);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_RDI);
  *(undefined4 *)&in_RDI[2].super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0xf;
  std::operator<<((ostream *)&std::cout,
                  "TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp): One should not invoke this copy constructor"
                 );
  pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  return;
}

Assistant:

TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp) : TPZAnalyticSolution(cp),fExact(cp.fExact) {
    std::cout << "TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp): One should not invoke this copy constructor";
    DebugStop();
}